

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O1

int __thiscall CppJieba::MPSegment::init(MPSegment *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long extraout_RAX;
  string local_38;
  uint7 extraout_var;
  
  if ((this->super_SegmentBase)._isInited == true) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"already inited before now.","");
    Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x2f,&local_38);
  }
  else {
    iVar3 = Trie::init(&this->_trie,ctx);
    if ((char)iVar3 != '\0') {
      paVar1 = &local_38.field_2;
      local_38._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"_trie.loadDict(%s) start...","");
      Limonp::Logger::LoggingF(1,"MPSegment.hpp",0x37,&local_38,(this->_dictPath)._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != paVar1) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      bVar2 = Trie::loadDict(&this->_trie,(this->_dictPath)._M_dataplus._M_p);
      if (bVar2) {
        local_38._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"_trie.loadDict end.","");
        Limonp::Logger::LoggingF(1,"MPSegment.hpp",0x3d,&local_38);
        lVar4 = (ulong)extraout_var << 8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != paVar1) {
          operator_delete(local_38._M_dataplus._M_p);
          lVar4 = extraout_RAX;
        }
        (this->super_SegmentBase)._isInited = true;
        return (int)CONCAT71((int7)((ulong)lVar4 >> 8),1);
      }
      local_38._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"_trie.loadDict faield.","");
      Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x3a,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == paVar1) {
        return 0;
      }
      goto LAB_0010afa8;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"_trie.init failed.","");
    Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x34,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    return 0;
  }
LAB_0010afa8:
  operator_delete(local_38._M_dataplus._M_p);
  return 0;
}

Assistant:

virtual bool init()
            {
                if(_getInitFlag())
                {
                    LogError("already inited before now.");
                    return false;
                }
                if(!_trie.init())
                {
                    LogError("_trie.init failed.");
                    return false;
                }
                LogInfo("_trie.loadDict(%s) start...", _dictPath.c_str());
                if(!_trie.loadDict(_dictPath.c_str()))
                {
                    LogError("_trie.loadDict faield.");
                    return false;
                }
                LogInfo("_trie.loadDict end.");
                return _setInitFlag(true);
            }